

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O2

bool __thiscall
Process::Converter::redirect
          (Converter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"rsrc/C/",
                 (v->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  std::operator+(&bStack_58,&local_38,".txt");
  Parsing::File::setPath(&this->_f,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = Parsing::File::isFile(&this->_f);
  if (bVar2) {
    pbVar1 = (v->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(v->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (lVar3 == 2) {
      bVar2 = transcript(this,pbVar1 + 1);
    }
    else if (lVar3 == 3) {
      bVar2 = transcript(this,pbVar1 + 1,pbVar1 + 2);
    }
    else {
      transcript(this);
      bVar2 = true;
    }
  }
  else {
    std::operator+(&local_38,"Missing file : ",&(this->_f)._path);
    std::operator+(&bStack_58,&local_38," in rsrc!");
    error(this,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Converter::redirect(const std::vector<std::string> &v)
    {
        _f.setPath("rsrc/C/" + v[0] + ".txt");
        if (!_f.isFile())
            return error("Missing file : " + _f.getPath() + " in rsrc!");

        if (v.size() == 3)
            return transcript(v[1], v[2]);
        else if (v.size() == 2)
            return transcript(v[1]);
        return transcript();
    }